

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void finalize_preconditioner<dense_parameters>
               (vw *param_1,bfgs *b,float regularization,dense_parameters *weights)

{
  uint32_t uVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint64_t uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  anon_union_4_2_947300a4 x;
  float fVar9;
  float fVar10;
  
  uVar6 = 1L << ((byte)weights->_stride_shift & 0x3f);
  pfVar3 = weights->_begin;
  if (b->regularizers == (weight *)0x0) {
    fVar8 = 0.0;
    for (pfVar4 = pfVar3; uVar5 = weights->_weight_mask, pfVar2 = pfVar3,
        pfVar4 != pfVar3 + uVar5 + 1; pfVar4 = pfVar4 + uVar6) {
      fVar9 = pfVar4[3] + regularization;
      fVar10 = fVar9;
      if (fVar9 <= fVar8) {
        fVar10 = fVar8;
      }
      pfVar4[3] = (float)(~-(uint)(0.0 < fVar9) & (uint)fVar9 |
                         (uint)(1.0 / fVar9) & -(uint)(0.0 < fVar9));
      pfVar3 = weights->_begin;
      fVar8 = fVar10;
    }
  }
  else {
    pfVar2 = pfVar3;
    fVar8 = 0.0;
    for (lVar7 = 0; uVar5 = weights->_weight_mask,
        (float *)((long)pfVar3 + lVar7) != pfVar2 + uVar5 + 1;
        lVar7 = lVar7 + (uVar6 & 0xffffffff) * 4) {
      fVar9 = b->regularizers[((ulong)(lVar7 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * 2] +
              *(float *)((long)pfVar3 + lVar7 + 0xc);
      fVar10 = fVar9;
      if (fVar9 <= fVar8) {
        fVar10 = fVar8;
      }
      *(uint *)((long)pfVar3 + lVar7 + 0xc) =
           ~-(uint)(0.0 < fVar9) & (uint)fVar9 | (uint)(1.0 / fVar9) & -(uint)(0.0 < fVar9);
      pfVar2 = weights->_begin;
      fVar8 = fVar10;
    }
  }
  uVar1 = weights->_stride_shift;
  fVar8 = (float)(~-(uint)(fVar8 == 0.0) & (uint)(10000.0 / fVar8));
  for (pfVar3 = pfVar2; pfVar3 != pfVar2 + uVar5 + 1; pfVar3 = pfVar3 + (1L << ((byte)uVar1 & 0x3f))
      ) {
    if ((((uint)*pfVar3 & 0x7fc00000) == 0x7f800000) || (fVar8 < *pfVar3)) {
      pfVar3[3] = fVar8;
      pfVar2 = weights->_begin;
      uVar5 = weights->_weight_mask;
    }
  }
  return;
}

Assistant:

void zero_derivative(vw& all) { all.weights.set_zero(W_GT); }